

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeMemOpenIpcHandle
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_ipc_mem_handle_t handle,
          ze_ipc_memory_flags_t flags,void **pptr)

{
  code *pcVar1;
  undefined1 local_78 [64];
  code *local_38;
  ze_pfnMemOpenIpcHandle_t pfnOpenIpcHandle;
  void **ppvStack_28;
  ze_result_t result;
  void **pptr_local;
  ze_device_handle_t p_Stack_18;
  ze_ipc_memory_flags_t flags_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  pcVar1 = DAT_0011c520;
  pfnOpenIpcHandle._4_4_ = ZE_RESULT_SUCCESS;
  local_38 = DAT_0011c520;
  if (DAT_0011c520 != (code *)0x0) {
    ppvStack_28 = pptr;
    pptr_local._4_4_ = flags;
    p_Stack_18 = hDevice;
    hDevice_local = (ze_device_handle_t)hContext;
    memcpy(local_78,&handle,0x40);
    pfnOpenIpcHandle._4_4_ = (*pcVar1)(hContext,hDevice,pptr_local._4_4_,ppvStack_28);
  }
  return pfnOpenIpcHandle._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemOpenIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device to associate with the IPC memory handle
        ze_ipc_mem_handle_t handle,                     ///< [in] IPC memory handle
        ze_ipc_memory_flags_t flags,                    ///< [in] flags controlling the operation.
                                                        ///< must be 0 (default) or a valid combination of ::ze_ipc_memory_flag_t.
        void** pptr                                     ///< [out] pointer to device allocation in this process
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnOpenIpcHandle = context.zeDdiTable.Mem.pfnOpenIpcHandle;
        if( nullptr != pfnOpenIpcHandle )
        {
            result = pfnOpenIpcHandle( hContext, hDevice, handle, flags, pptr );
        }
        else
        {
            // generic implementation
        }

        return result;
    }